

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utPretransformVertices.cpp
# Opt level: O0

void __thiscall PretransformVerticesTest::SetUp(PretransformVerticesTest *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  aiScene *this_00;
  aiMaterial **ppaVar4;
  aiMaterial *this_01;
  aiMesh **ppaVar5;
  aiMesh *this_02;
  ulong uVar6;
  ulong uVar7;
  ulong *puVar8;
  aiVector3D *paVar9;
  uint *puVar10;
  aiNode *this_03;
  PretransformVertices *this_04;
  aiFace *paVar11;
  ulong uVar12;
  aiVector3t<float> *local_d8;
  aiVector3t<float> *local_b0;
  aiFace *local_88;
  uint local_50;
  float fStack_4c;
  uint normalIdx;
  float local_44;
  aiFace *local_40;
  aiFace *f;
  aiMesh *paStack_30;
  uint a;
  aiMesh *mesh;
  uint local_20;
  uint i_1;
  uint i;
  PretransformVerticesTest *local_10;
  PretransformVerticesTest *this_local;
  
  local_10 = this;
  this_00 = (aiScene *)operator_new(0x80);
  aiScene::aiScene(this_00);
  this->mScene = this_00;
  this->mScene->mNumMaterials = 5;
  ppaVar4 = (aiMaterial **)operator_new__(0x28);
  this->mScene->mMaterials = ppaVar4;
  for (local_20 = 0; local_20 < 5; local_20 = local_20 + 1) {
    this_01 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this_01);
    this->mScene->mMaterials[local_20] = this_01;
  }
  this->mScene->mNumMeshes = 0x19;
  ppaVar5 = (aiMesh **)operator_new__(200);
  this->mScene->mMeshes = ppaVar5;
  for (mesh._4_4_ = 0; mesh._4_4_ < 0x19; mesh._4_4_ = mesh._4_4_ + 1) {
    this_02 = (aiMesh *)operator_new(0x520);
    aiMesh::aiMesh(this_02);
    this->mScene->mMeshes[mesh._4_4_] = this_02;
    this_02->mPrimitiveTypes = 1;
    this_02->mNumFaces = mesh._4_4_ + 10;
    uVar6 = CONCAT44(0,mesh._4_4_ + 10);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar6;
    uVar7 = SUB168(auVar1 * ZEXT816(0x10),0);
    uVar12 = uVar7 + 8;
    if (SUB168(auVar1 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar7) {
      uVar12 = 0xffffffffffffffff;
    }
    paStack_30 = this_02;
    puVar8 = (ulong *)operator_new__(uVar12);
    *puVar8 = uVar6;
    paVar11 = (aiFace *)(puVar8 + 1);
    if (uVar6 != 0) {
      local_88 = paVar11;
      do {
        aiFace::aiFace(local_88);
        local_88 = local_88 + 1;
      } while (local_88 != paVar11 + uVar6);
    }
    paStack_30->mFaces = paVar11;
    paStack_30->mNumVertices = paStack_30->mNumFaces;
    uVar6 = CONCAT44(0,paStack_30->mNumFaces);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar6;
    uVar7 = SUB168(auVar2 * ZEXT816(0xc),0);
    if (SUB168(auVar2 * ZEXT816(0xc),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    paVar9 = (aiVector3D *)operator_new__(uVar7);
    if (uVar6 != 0) {
      local_b0 = paVar9;
      do {
        aiVector3t<float>::aiVector3t(local_b0);
        local_b0 = local_b0 + 1;
      } while (local_b0 != paVar9 + uVar6);
    }
    paStack_30->mVertices = paVar9;
    for (f._4_4_ = 0; f._4_4_ < paStack_30->mNumFaces; f._4_4_ = f._4_4_ + 1) {
      local_40 = paStack_30->mFaces + f._4_4_;
      local_40->mNumIndices = 1;
      puVar10 = (uint *)operator_new__(4);
      local_40->mIndices = puVar10;
      *local_40->mIndices = f._4_4_ * 3;
      aiVector3t<float>::aiVector3t
                ((aiVector3t<float> *)&stack0xffffffffffffffb4,(float)mesh._4_4_,(float)f._4_4_,0.0)
      ;
      paVar9 = paStack_30->mVertices + f._4_4_;
      paVar9->x = fStack_4c;
      paVar9->y = (float)normalIdx;
      paVar9->z = local_44;
    }
    paStack_30->mMaterialIndex = mesh._4_4_ % 5;
    if ((mesh._4_4_ & 1) != 0) {
      uVar6 = CONCAT44(0,paStack_30->mNumVertices);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar6;
      uVar7 = SUB168(auVar3 * ZEXT816(0xc),0);
      if (SUB168(auVar3 * ZEXT816(0xc),8) != 0) {
        uVar7 = 0xffffffffffffffff;
      }
      paVar9 = (aiVector3D *)operator_new__(uVar7);
      if (uVar6 != 0) {
        local_d8 = paVar9;
        do {
          aiVector3t<float>::aiVector3t(local_d8);
          local_d8 = local_d8 + 1;
        } while (local_d8 != paVar9 + uVar6);
      }
      paStack_30->mNormals = paVar9;
      for (local_50 = 0; local_50 < paStack_30->mNumVertices; local_50 = local_50 + 1) {
        paStack_30->mNormals[local_50].x = 1.0;
        paStack_30->mNormals[local_50].y = 1.0;
        paStack_30->mNormals[local_50].z = 1.0;
        aiVector3t<float>::Normalize(paStack_30->mNormals + local_50);
      }
    }
  }
  this_03 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_03);
  this->mScene->mRootNode = this_03;
  aiString::Set(&this->mScene->mRootNode->mName,"Root");
  AddNodes(0,this->mScene->mRootNode,2);
  this_04 = (PretransformVertices *)operator_new(0x60);
  Assimp::PretransformVertices::PretransformVertices(this_04);
  this->mProcess = this_04;
  return;
}

Assistant:

void PretransformVerticesTest::SetUp() {
    mScene = new aiScene();

    // add 5 empty materials
    mScene->mMaterials = new aiMaterial*[mScene->mNumMaterials = 5];
    for (unsigned int i = 0; i < 5;++i) {
        mScene->mMaterials[i] = new aiMaterial();
    }

    // add 25 test meshes
    mScene->mMeshes = new aiMesh*[mScene->mNumMeshes = 25];
    for ( unsigned int i = 0; i < 25; ++i) { 
        aiMesh* mesh = mScene->mMeshes[ i ] = new aiMesh();

        mesh->mPrimitiveTypes = aiPrimitiveType_POINT;
        mesh->mFaces = new aiFace[ mesh->mNumFaces = 10+i ];
        mesh->mVertices = new aiVector3D[mesh->mNumVertices = mesh->mNumFaces];
        for (unsigned int a = 0; a < mesh->mNumFaces; ++a ) {
            aiFace& f = mesh->mFaces[ a ];
            f.mIndices = new unsigned int [ f.mNumIndices = 1 ];
            f.mIndices[0] = a*3;

            mesh->mVertices[a] = aiVector3D((float)i,(float)a,0.f);
        }
        mesh->mMaterialIndex = i%5;

        if (i % 2) {
            mesh->mNormals = new aiVector3D[mesh->mNumVertices];
            for ( unsigned int normalIdx=0; normalIdx<mesh->mNumVertices; ++normalIdx ) {
                mesh->mNormals[ normalIdx ].x = 1.0f;
                mesh->mNormals[ normalIdx ].y = 1.0f;
                mesh->mNormals[ normalIdx ].z = 1.0f;
                mesh->mNormals[ normalIdx ].Normalize();
            }
        }
    }

    // construct some nodes (1+25)
    mScene->mRootNode = new aiNode();
    mScene->mRootNode->mName.Set("Root");
    AddNodes(0, mScene->mRootNode, 2);

    mProcess = new PretransformVertices();
}